

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-to-string.h
# Opt level: O0

void __thiscall
double_conversion::DoubleToStringConverter::DoubleToStringConverter
          (DoubleToStringConverter *this,int flags,char *infinity_symbol,char *nan_symbol,
          char exponent_character,int decimal_in_shortest_low,int decimal_in_shortest_high,
          int max_leading_padding_zeroes_in_precision_mode,
          int max_trailing_padding_zeroes_in_precision_mode,int min_exponent_width)

{
  int decimal_in_shortest_low_local;
  char exponent_character_local;
  char *nan_symbol_local;
  char *infinity_symbol_local;
  int flags_local;
  DoubleToStringConverter *this_local;
  
  this->flags_ = flags;
  this->infinity_symbol_ = infinity_symbol;
  this->nan_symbol_ = nan_symbol;
  this->exponent_character_ = exponent_character;
  this->decimal_in_shortest_low_ = decimal_in_shortest_low;
  this->decimal_in_shortest_high_ = decimal_in_shortest_high;
  this->max_leading_padding_zeroes_in_precision_mode_ = max_leading_padding_zeroes_in_precision_mode
  ;
  this->max_trailing_padding_zeroes_in_precision_mode_ =
       max_trailing_padding_zeroes_in_precision_mode;
  this->min_exponent_width_ = min_exponent_width;
  return;
}

Assistant:

DoubleToStringConverter(int flags,
                          const char* infinity_symbol,
                          const char* nan_symbol,
                          char exponent_character,
                          int decimal_in_shortest_low,
                          int decimal_in_shortest_high,
                          int max_leading_padding_zeroes_in_precision_mode,
                          int max_trailing_padding_zeroes_in_precision_mode,
                          int min_exponent_width = 0)
      : flags_(flags),
        infinity_symbol_(infinity_symbol),
        nan_symbol_(nan_symbol),
        exponent_character_(exponent_character),
        decimal_in_shortest_low_(decimal_in_shortest_low),
        decimal_in_shortest_high_(decimal_in_shortest_high),
        max_leading_padding_zeroes_in_precision_mode_(
            max_leading_padding_zeroes_in_precision_mode),
        max_trailing_padding_zeroes_in_precision_mode_(
            max_trailing_padding_zeroes_in_precision_mode),
        min_exponent_width_(min_exponent_width) {
    // When 'trailing zero after the point' is set, then 'trailing point'
    // must be set too.
    DOUBLE_CONVERSION_ASSERT(((flags & EMIT_TRAILING_DECIMAL_POINT) != 0) ||
        !((flags & EMIT_TRAILING_ZERO_AFTER_POINT) != 0));
  }